

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::evalTexture1DProj2Bias(ShaderEvalContext *c,TexLookupParams *p)

{
  Texture1D *pTVar1;
  int i_1;
  int i;
  long lVar2;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  float local_48 [4];
  undefined8 local_38;
  undefined8 uStack_30;
  float local_28 [4];
  
  pTVar1 = c->textures[0].tex1D;
  lVar2 = 0;
  tcu::sampleLevelArray1D
            ((ConstPixelBufferAccess *)local_28,(int)(pTVar1->m_view).m_levels,
             (Sampler *)(ulong)(uint)(pTVar1->m_view).m_numLevels,
             c->in[0].m_data[0] / c->in[0].m_data[1],(int)c + 0x70,p->lod + c->in[1].m_data[0]);
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  local_48[2] = 0.0;
  local_48[3] = 0.0;
  do {
    local_48[lVar2] = local_28[lVar2] * (p->scale).m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_38 = 0;
  uStack_30 = 0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_38 + lVar2 * 4) = local_48[lVar2] + (p->bias).m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  *(undefined8 *)(c->color).m_data = local_38;
  *(undefined8 *)((c->color).m_data + 2) = uStack_30;
  return;
}

Assistant:

static void		evalTexture1DProj2Bias	(ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture1D(c, c.in[0].x()/c.in[0].y(), p.lod+c.in[1].x())*p.scale + p.bias; }